

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinomialQueue.hpp
# Opt level: O2

size_t __thiscall
guts::BinomialQueue<int>::remove_sub(BinomialQueue<int> *this,size_t index,size_t prev)

{
  pointer pNVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  
  uVar4 = index;
  do {
    uVar4 = (this->mNodes).
            super__Vector_base<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar4].mRchild;
  } while (uVar4 < 0x80000000);
  if (uVar4 != 0xffffffffffffffff) {
    uVar4 = (ulong)((uint)uVar4 & 0x7fffffff);
    sVar3 = remove_sub(this,uVar4,prev);
    pNVar1 = (this->mNodes).
             super__Vector_base<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar5 = pNVar1[uVar4].mLchild;
    while (sVar5 != index) {
      sVar2 = pNVar1[sVar5].mRchild;
      pNVar1[sVar5].mRchild = sVar3;
      sVar3 = sVar5;
      sVar5 = sVar2;
    }
    uVar6 = 0xffffffffffffffff;
    if (pNVar1[index].mRchild < 0x80000000) {
      uVar6 = pNVar1[index].mRchild;
    }
    pNVar1[uVar4].mLchild = uVar6;
    pNVar1[uVar4].mRchild = sVar3;
    prev = uVar4;
  }
  return prev;
}

Assistant:

size_t BinomialQueue<Key>::remove_sub(size_t index, size_t prev)
    { 
        size_t parent = mNodes[index].mRchild;
        while ((parent & PARENT_REF) == 0)
        {
            parent = mNodes[parent].mRchild;
        } 
                
        if (parent != NO_REF)
        {
            parent &= ~PARENT_REF;

            prev = remove_sub(parent, prev);

            size_t child = mNodes[parent].mLchild;
            
            while (child != index)
            {
                size_t next = mNodes[child].mRchild;
                mNodes[child].mRchild = prev;
                prev = child;
                child = next;
            }
            
            mNodes[parent].mLchild = (mNodes[index].mRchild & PARENT_REF) == 0 ? mNodes[index].mRchild : NO_REF;
            mNodes[parent].mRchild = prev;
            prev = parent;
        }

        return prev;
    }